

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O3

int32_t ulocimp_getCountry_63(char *localeID,char *country,int32_t countryCapacity,char **pEnd)

{
  byte c;
  char *pcVar1;
  char cVar2;
  ushort uVar3;
  uint in_EAX;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  char cnty [4];
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  uVar9 = 0;
  while( true ) {
    c = localeID[uVar9];
    if (((c - 0x2d < 0x33) && ((0x4000000080003U >> ((ulong)(c - 0x2d) & 0x3f) & 1) != 0)) ||
       (c == 0)) break;
    if (uVar9 < 3) {
      cVar2 = uprv_toupper_63(c);
      *(char *)((long)&uStack_38 + uVar9 + 4) = cVar2;
    }
    uVar9 = uVar9 + 1;
  }
  uVar6 = 0;
  if (((uint)uVar9 & 0x7ffffffe) == 2) {
    if (uVar9 == 0) {
      uVar6 = 0;
    }
    else if ((uVar9 == 3) &&
            (uVar3 = _findIndex(COUNTRIES_3,(char *)((long)&uStack_38 + 4)), -1 < (short)uVar3)) {
      pcVar1 = COUNTRIES[uVar3];
      cVar2 = *pcVar1;
      pcVar8 = pcVar1;
      if (cVar2 != '\0') {
        lVar7 = 0;
        do {
          if (countryCapacity < 1) {
            sVar4 = strlen(pcVar1 + lVar7);
            uVar6 = (int)lVar7 + (int)sVar4;
            goto LAB_002afd26;
          }
          country[lVar7] = cVar2;
          countryCapacity = countryCapacity + -1;
          cVar2 = pcVar1[lVar7 + 1];
          lVar7 = lVar7 + 1;
        } while (cVar2 != '\0');
        pcVar8 = pcVar1 + lVar7;
      }
      uVar6 = (int)pcVar8 - (int)pcVar1;
    }
    else {
      uVar5 = 0;
      do {
        if ((long)uVar5 < (long)countryCapacity) {
          cVar2 = uprv_toupper_63(localeID[uVar5]);
          country[uVar5] = cVar2;
        }
        uVar5 = uVar5 + 1;
        uVar6 = (uint)uVar9;
      } while (uVar9 != uVar5);
    }
LAB_002afd26:
    localeID = localeID + (int)uVar6;
  }
  if (pEnd != (char **)0x0) {
    *pEnd = localeID;
  }
  return uVar6;
}

Assistant:

U_CFUNC int32_t
ulocimp_getCountry(const char *localeID,
                   char *country, int32_t countryCapacity,
                   const char **pEnd)
{
    int32_t idLen=0;
    char cnty[ULOC_COUNTRY_CAPACITY]={ 0, 0, 0, 0 };
    int32_t offset;

    /* copy the country as far as possible and count its length */
    while(!_isTerminator(localeID[idLen]) && !_isIDSeparator(localeID[idLen])) {
        if(idLen<(ULOC_COUNTRY_CAPACITY-1)) {   /*CWB*/
            cnty[idLen]=(char)uprv_toupper(localeID[idLen]);
        }
        idLen++;
    }

    /* the country should be either length 2 or 3 */
    if (idLen == 2 || idLen == 3) {
        UBool gotCountry = FALSE;
        /* convert 3 character code to 2 character code if possible *CWB*/
        if(idLen==3) {
            offset=_findIndex(COUNTRIES_3, cnty);
            if(offset>=0) {
                idLen=_copyCount(country, countryCapacity, COUNTRIES[offset]);
                gotCountry = TRUE;
            }
        }
        if (!gotCountry) {
            int32_t i = 0;
            for (i = 0; i < idLen; i++) {
                if (i < countryCapacity) {
                    country[i]=(char)uprv_toupper(localeID[i]);
                }
            }
        }
        localeID+=idLen;
    } else {
        idLen = 0;
    }

    if(pEnd!=NULL) {
        *pEnd=localeID;
    }

    return idLen;
}